

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O0

BoolAndFTShort __thiscall FreeTypeFaceWrapper::GetxHeightInternal(FreeTypeFaceWrapper *this)

{
  BoolAndFTShort fontDependentResult;
  FreeTypeFaceWrapper *this_local;
  
  if (this->mFormatParticularWrapper == (IFreeTypeFaceExtender *)0x0) {
    this_local._4_4_ = XHeightFromLowerXHeight(this);
  }
  else {
    this_local._4_4_ =
         (BoolAndFTShort)(*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[4])();
    if (((uint)this_local._4_4_ & 1) == 0) {
      this_local._4_4_ = XHeightFromLowerXHeight(this);
    }
  }
  return this_local._4_4_;
}

Assistant:

BoolAndFTShort FreeTypeFaceWrapper::GetxHeightInternal()
{
	if(mFormatParticularWrapper)
	{
		BoolAndFTShort fontDependentResult = mFormatParticularWrapper->GetxHeight();
		if(fontDependentResult.first)
			return fontDependentResult;
		else
			return XHeightFromLowerXHeight();

	}
	else
		return XHeightFromLowerXHeight();
}